

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locutil.cpp
# Opt level: O3

UnicodeString * icu_63::LocaleUtility::initNameFromLocale(Locale *locale,UnicodeString *result)

{
  UnicodeString local_50;
  
  if (locale->fIsBogus == '\0') {
    UnicodeString::UnicodeString(&local_50,locale->fullName,-1,kInvariant);
    if (-1 < local_50.fUnion.fStackFields.fLengthAndFlags) {
      local_50.fUnion.fFields.fLength = (int)local_50.fUnion.fStackFields.fLengthAndFlags >> 5;
    }
    UnicodeString::doAppend(result,&local_50,0,local_50.fUnion.fFields.fLength);
    UnicodeString::~UnicodeString(&local_50);
  }
  else {
    UnicodeString::setToBogus(result);
  }
  return result;
}

Assistant:

UnicodeString&
LocaleUtility::initNameFromLocale(const Locale& locale, UnicodeString& result)
{
    if (locale.isBogus()) {
        result.setToBogus();
    } else {
        result.append(UnicodeString(locale.getName(), -1, US_INV));
    }
    return result;
}